

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O2

bool __thiscall cppcms::widgets::numeric<int>::validate(numeric<int> *this)

{
  char cVar1;
  
  cVar1 = cppcms::widgets::base_widget::valid();
  if (cVar1 != '\0') {
    cVar1 = cppcms::widgets::base_widget::set();
    if (cVar1 == '\0') {
      if (this->non_empty_ == false) {
        return true;
      }
    }
    else if ((this->check_low_ != true) || (this->min_ <= this->value_)) {
      if (this->check_high_ != true) {
        return true;
      }
      if (this->value_ <= this->max_) {
        return true;
      }
    }
    cppcms::widgets::base_widget::valid
              ((bool)((char)this + (char)*(undefined8 *)(*(long *)this + -0x18)));
  }
  return false;
}

Assistant:

virtual bool validate()
			{
				if(!valid())
					return false;
				if(!set()) {
					if(non_empty_) {
						valid(false);
						return false;
					}
					return true;
				}
				if(check_low_ && value_ <min_) {
					valid(false);
					return false;
				}
				if(check_high_ && value_ > max_) {
					valid(false);
					return false;
				}
				return true;
			}